

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::ServiceDescriptor::CopyTo(ServiceDescriptor *this,ServiceDescriptorProto *proto)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  void **ppvVar5;
  string *psVar6;
  MethodDescriptorProto *proto_00;
  ServiceOptions *pSVar7;
  ServiceOptions *pSVar8;
  long lVar9;
  long lVar10;
  
  proto->_has_bits_[0] = proto->_has_bits_[0] | 1;
  if (proto->name_ == (string *)internal::kEmptyString_abi_cxx11_) {
    psVar6 = (string *)operator_new(0x20);
    (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
    psVar6->_M_string_length = 0;
    (psVar6->field_2)._M_local_buf[0] = '\0';
    proto->name_ = psVar6;
  }
  std::__cxx11::string::_M_assign((string *)proto->name_);
  if (0 < *(int *)(this + 0x20)) {
    lVar10 = 0;
    lVar9 = 0;
    do {
      lVar4 = *(long *)(this + 0x28);
      iVar2 = (proto->method_).super_RepeatedPtrFieldBase.current_size_;
      iVar3 = (proto->method_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar2 < iVar3) {
        ppvVar5 = (proto->method_).super_RepeatedPtrFieldBase.elements_;
        (proto->method_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        proto_00 = (MethodDescriptorProto *)ppvVar5[iVar2];
      }
      else {
        iVar2 = (proto->method_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar3 == iVar2) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(proto->method_).super_RepeatedPtrFieldBase,iVar2 + 1);
        }
        piVar1 = &(proto->method_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        proto_00 = internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>::New();
        ppvVar5 = (proto->method_).super_RepeatedPtrFieldBase.elements_;
        iVar2 = (proto->method_).super_RepeatedPtrFieldBase.current_size_;
        (proto->method_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        ppvVar5[iVar2] = proto_00;
      }
      MethodDescriptor::CopyTo((MethodDescriptor *)(lVar4 + lVar10),proto_00);
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0x30;
    } while (lVar9 < *(int *)(this + 0x20));
  }
  pSVar8 = *(ServiceOptions **)(this + 0x18);
  pSVar7 = ServiceOptions::default_instance();
  if (pSVar8 != pSVar7) {
    *(byte *)proto->_has_bits_ = (byte)proto->_has_bits_[0] | 4;
    if (proto->options_ == (ServiceOptions *)0x0) {
      pSVar8 = (ServiceOptions *)operator_new(0x60);
      ServiceOptions::ServiceOptions(pSVar8);
      proto->options_ = pSVar8;
    }
    ServiceOptions::CopyFrom(proto->options_,*(ServiceOptions **)(this + 0x18));
    return;
  }
  return;
}

Assistant:

void ServiceDescriptor::CopyTo(ServiceDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < method_count(); i++) {
    method(i)->CopyTo(proto->add_method());
  }

  if (&options() != &ServiceOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}